

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

void printf_block_definition(BlockDefinition *block_definition,uint alignment)

{
  BlockDefinitionType BVar1;
  uint uVar2;
  Expression *expression;
  ForBlockDefinition *for_block_definition;
  ulong uVar3;
  
  while (BVar1 = block_definition->block_definition_type,
        BVar1 == BlockDefinitionTypeIfElseGroupBlock) {
    if (*(long *)(block_definition + 2) != 0) {
      uVar3 = 0;
      do {
        printf_block_definition
                  (*(BlockDefinition **)(*(long *)(block_definition + 4) + uVar3 * 8),alignment);
        uVar3 = uVar3 + 1;
      } while (uVar3 < *(ulong *)(block_definition + 2));
    }
    block_definition = *(BlockDefinition **)(block_definition + 6);
    if (block_definition == (BlockDefinition *)0x0) {
      return;
    }
  }
  if (BVar1 == BlockDefinitionTypeIfBlock) {
    uVar2 = alignment;
    if (alignment != 0) {
      do {
        printf("    ");
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    printf("IF");
    if (*(Expression **)(block_definition + 4) != (Expression *)0x0) {
      printf_expression(*(Expression **)(block_definition + 4),alignment);
      putchar(0x3b);
    }
    expression = *(Expression **)(block_definition + 6);
LAB_001055b0:
    printf_expression(expression,alignment);
  }
  else {
    if (BVar1 == BlockDefinitionTypeElseBlock) goto LAB_001055c1;
    if (BVar1 != BlockDefinitionTypeForBlock) {
      return;
    }
    uVar2 = alignment;
    if (alignment != 0) {
      do {
        printf("    ");
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    printf("FOR");
    if (*(Expression **)(block_definition + 4) != (Expression *)0x0) {
      printf_expression(*(Expression **)(block_definition + 4),alignment);
      putchar(0x3b);
    }
    printf_expression(*(Expression **)(block_definition + 6),alignment);
    if (*(long *)(block_definition + 8) != 0) {
      putchar(0x3b);
      expression = *(Expression **)(block_definition + 8);
      goto LAB_001055b0;
    }
  }
  putchar(10);
LAB_001055c1:
  printf_block(*(Block **)(block_definition + 2),alignment);
  return;
}

Assistant:

void printf_block_definition(BlockDefinition *block_definition, unsigned int alignment) {
  switch (block_definition->block_definition_type) {
    case BlockDefinitionTypeIfElseGroupBlock: {
      IfElseGroupBlockDefinition *if_else_group_block_definition = (IfElseGroupBlockDefinition *)block_definition;

      for (size_t i = 0; i < if_else_group_block_definition->if_block_definitions_length; i++) {
        printf_block_definition((BlockDefinition *) if_else_group_block_definition->if_block_definitions[i], alignment);
      }

      if (if_else_group_block_definition->else_block_definition) {
        printf_block_definition((BlockDefinition *) if_else_group_block_definition->else_block_definition, alignment);
      }

      break;
    }

    case BlockDefinitionTypeIfBlock: {
      IfBlockDefinition *if_block_definition = (IfBlockDefinition *)block_definition;

      printf_alignment(alignment);
      printf("IF");

      if (if_block_definition->pre_expression) {
        printf_expression(if_block_definition->pre_expression, alignment);
        printf(";");
      }

      printf_expression(if_block_definition->condition, alignment);
      printf("\n");
      printf_block(if_block_definition->block, alignment);

      break;
    }

    case BlockDefinitionTypeElseBlock: {
      ElseBlockDefinition *else_block_definition = (ElseBlockDefinition *) block_definition;
      printf_block(else_block_definition->block, alignment);

      break;
    }

    case BlockDefinitionTypeForBlock: {
      ForBlockDefinition *for_block_definition = (ForBlockDefinition *)block_definition;

      printf_alignment(alignment);
      printf("FOR");

      if (for_block_definition->pre_expression) {
        printf_expression(for_block_definition->pre_expression, alignment);
        printf(";");
      }

      printf_expression(for_block_definition->condition, alignment);

      if (for_block_definition->post_expression) {
        printf(";");
        printf_expression(for_block_definition->post_expression, alignment);
      }
      printf("\n");
      printf_block(for_block_definition->block, alignment);

      break;
    }
  }
}